

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O0

int64_t file_seek(archive_conflict *a,void *client_data,int64_t request,wchar_t whence)

{
  int *piVar1;
  wchar_t seek_bits;
  int64_t r;
  off_t seek;
  read_file_data *mine;
  wchar_t whence_local;
  int64_t request_local;
  void *client_data_local;
  archive_conflict *a_local;
  
  a_local = (archive_conflict *)lseek(*client_data,request,whence);
  if ((long)a_local < 0) {
    if (*(int *)((long)client_data + 0x2c) == 0) {
      piVar1 = __errno_location();
      archive_set_error((archive *)a,*piVar1,"Error seeking in stdin");
    }
    else if (*(int *)((long)client_data + 0x2c) == 1) {
      piVar1 = __errno_location();
      archive_set_error((archive *)a,*piVar1,"Error seeking in \'%s\'",(long)client_data + 0x30);
    }
    else {
      piVar1 = __errno_location();
      archive_set_error((archive *)a,*piVar1,"Error seeking in \'%ls\'",(long)client_data + 0x30);
    }
    a_local = (archive_conflict *)0xffffffffffffffe2;
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *data, int64_t request, int whence)
{
  struct mydata *mine = (struct mydata *)data;
  int64_t r;

  (void)a;
  r = lseek(mine->fd, request, whence);
  if (r >= 0)
    return r;
  return (ARCHIVE_FATAL);
}